

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O2

_Bool SystemZ_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  byte bVar2;
  cs_detail *__s;
  long lVar3;
  DecodeStatus DVar4;
  size_t sVar5;
  uint64_t uVar6;
  ulong uVar7;
  uint64_t uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  ulong uVar11;
  uint16_t uVar12;
  void *Decoder;
  ulong insn;
  bool bVar13;
  bool bVar14;
  uint local_60;
  DecodeStatus local_5c;
  uint8_t Bytes [6];
  
  bVar13 = 0xbf < *code;
  puVar10 = DecoderTable48;
  if (!bVar13) {
    puVar10 = DecoderTable32;
  }
  bVar14 = 0x3f < *code;
  uVar12 = 2;
  if (bVar14) {
    uVar12 = bVar13 + 4 + (ushort)bVar13;
  }
  uVar11 = 2;
  if (bVar14) {
    uVar11 = (ulong)((uint)bVar13 * 2) | 4;
  }
  puVar9 = DecoderTable16;
  if (bVar14) {
    puVar9 = puVar10;
  }
  *size = uVar12;
  if (code_len < uVar11) {
LAB_001ba3c6:
    return false;
  }
  __s = MI->flat_insn->detail;
  Decoder = (void *)address;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x5f8);
    uVar11 = (ulong)*size;
  }
  memcpy(Bytes,code,uVar11);
  insn = 0;
  for (sVar5 = 0; uVar11 != sVar5; sVar5 = sVar5 + 1) {
    insn = insn << 8 | (ulong)Bytes[sVar5];
  }
  uVar11 = 0;
  local_5c = MCDisassembler_Success;
LAB_001ba21c:
LAB_001ba224:
  puVar10 = puVar9;
  switch(*puVar10) {
  case '\x01':
    goto switchD_001ba23d_caseD_1;
  case '\x02':
    uVar6 = decodeULEB128(puVar10 + 1,&local_60);
    puVar9 = puVar10 + (ulong)local_60 + 3;
    if (uVar6 == (uVar11 & 0xffffffff)) goto LAB_001ba224;
    lVar3 = (ulong)local_60 + 1;
    break;
  case '\x03':
    bVar1 = puVar10[1];
    bVar2 = puVar10[2];
    local_60 = (uint)bVar2;
    uVar7 = ~(-1L << (bVar2 & 0x3f)) << (bVar1 & 0x3f);
    if (bVar2 == 0x40) {
      uVar7 = 0xffffffffffffffff;
    }
    uVar6 = decodeULEB128(puVar10 + 3,&local_60);
    puVar9 = puVar10 + (ulong)local_60 + 5;
    if ((uVar6 & 0xffffffff) == (uVar7 & insn) >> (bVar1 & 0x3f)) goto LAB_001ba224;
    lVar3 = (ulong)local_60 + 3;
    break;
  case '\x04':
    goto switchD_001ba23d_caseD_4;
  case '\x05':
    uVar6 = decodeULEB128(puVar10 + 1,&local_60);
    uVar8 = decodeULEB128(puVar10 + (ulong)local_60 + 1,&local_60);
    MCInst_setOpcode(MI,(uint)uVar6);
    DVar4 = decodeToMCInst(local_5c,(uint)uVar8,insn,MI,address,Decoder);
    return DVar4 != MCDisassembler_Fail;
  case '\x06':
    uVar6 = decodeULEB128(puVar10 + 1,&local_60);
    uVar7 = (ulong)local_60;
    uVar8 = decodeULEB128(puVar10 + uVar7 + 1,&local_60);
    puVar9 = puVar10 + uVar7 + 1 + local_60;
    if ((uVar8 & ~insn) != 0 || (uVar6 & insn) != 0) {
      local_5c = MCDisassembler_SoftFail;
    }
    goto LAB_001ba21c;
  default:
    goto LAB_001ba3c6;
  }
  puVar9 = puVar9 + *(ushort *)(puVar10 + lVar3);
  goto LAB_001ba224;
switchD_001ba23d_caseD_4:
  decodeULEB128(puVar10 + 1,&local_60);
  puVar9 = puVar10 + (ulong)local_60 + 3;
  goto LAB_001ba224;
switchD_001ba23d_caseD_1:
  bVar1 = puVar10[2];
  puVar9 = puVar10 + 3;
  local_60 = (uint)bVar1;
  uVar11 = ~(-1L << (bVar1 & 0x3f)) << (puVar10[1] & 0x3f);
  if (bVar1 == 0x40) {
    uVar11 = 0xffffffffffffffff;
  }
  uVar11 = (uVar11 & insn) >> (puVar10[1] & 0x3f);
  goto LAB_001ba21c;
}

Assistant:

bool SystemZ_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint64_t Inst;
	uint8_t Bytes[6];
	uint8_t *Table;
	uint16_t I; 

	// The top 2 bits of the first byte specify the size.
	if (*code < 0x40) {
		*size = 2;
		Table = DecoderTable16;
	} else if (*code < 0xc0) {
		*size = 4;
		Table = DecoderTable32;
	} else {
		*size = 6;
		Table = DecoderTable48;
	}

	if (code_len < *size)
		// short of input data
		return false;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
	}

	memcpy(Bytes, code, *size);

	// Construct the instruction.
	Inst = 0;
	for (I = 0; I < *size; ++I)
		Inst = (Inst << 8) | Bytes[I];

	return decodeInstruction(Table, MI, Inst, address, info, 0);
}